

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxFunctionCall::Resolve(FxFunctionCall *this,FCompileContext *ctx)

{
  FArgumentList *args;
  FScriptPosition *sc;
  long *plVar1;
  ENamedName EVar2;
  uint uVar3;
  FxExpression **ppFVar4;
  PType *type;
  bool bVar5;
  int iVar6;
  PFunction *callee;
  FxSelf *pFVar7;
  FxVMFunctionCall *this_00;
  undefined4 extraout_var;
  PClass *cls;
  FxConstant *pFVar9;
  PTextureID **ppPVar10;
  FxMinMax *this_01;
  FxConstant *this_02;
  FxExpression *pFVar11;
  FLOP *pFVar12;
  char *pcVar13;
  long lVar14;
  char *message;
  PClass *selfcls;
  PFunction *caller;
  FScriptPosition *pFVar15;
  FRandom *pFVar16;
  FRandom *pFVar17;
  TArray<FxExpression_*,_FxExpression_*> *expr;
  size_t sVar18;
  bool error;
  FRandom *local_98;
  int max;
  TArray<FxExpression_*,_FxExpression_*> pass;
  int min;
  FName local_74;
  FName local_70;
  FName local_6c;
  FName local_68;
  FName local_64;
  FName local_60;
  FName local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  FName local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  _func_int **pp_Var8;
  
  selfcls = (PClass *)ctx->Class;
  if (selfcls == (PClass *)0x0) goto LAB_005155b2;
  error = false;
  args = &this->ArgList;
  lVar14 = 0;
  do {
    if ((ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count << 3 == lVar14) {
      local_34.Index = (this->MethodName).Index;
      sc = &(this->super_FxExpression).ScriptPosition;
      callee = FindClassMemberFunction((PStruct *)selfcls,(PStruct *)selfcls,&local_34,sc,&error);
      if (callee == (PFunction *)0x0) {
        EVar2 = (this->MethodName).Index;
        pFVar12 = FxFlops;
        sVar18 = 0;
        goto LAB_00514e3c;
      }
      caller = ctx->Function;
      bVar5 = CheckFunctionCompatiblity(sc,caller,callee);
      if (!bVar5) goto LAB_005155b2;
      local_98 = (FRandom *)ctx;
      if ((((callee->Variants).Array)->Flags & 2) == 0) {
        pFVar7 = (FxSelf *)0x0;
      }
      else {
        pFVar7 = (FxSelf *)FxExpression::operator_new((FxExpression *)0x30,(size_t)caller);
        caller = (PFunction *)sc;
        FxSelf::FxSelf(pFVar7,sc,false);
      }
      this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x68,(size_t)caller);
      FxVMFunctionCall::FxVMFunctionCall(this_00,&pFVar7->super_FxExpression,callee,args,sc,false);
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      pp_Var8 = (this_00->super_FxExpression)._vptr_FxExpression;
      ctx = (FCompileContext *)local_98;
      goto LAB_00514efd;
    }
    plVar1 = (long *)((long)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array +
                     lVar14);
    lVar14 = lVar14 + 8;
  } while (*plVar1 != 0);
  FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,"Empty function argument.");
  goto LAB_00514dc3;
LAB_00514e3c:
  if (sVar18 == 0xf) goto LAB_00514e4f;
  if (EVar2 == pFVar12->Name) {
    this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x40,(size_t)selfcls);
    FxFlopFunctionCall::FxFlopFunctionCall((FxFlopFunctionCall *)this_00,sVar18,args,sc);
    goto LAB_00514e9b;
  }
  sVar18 = sVar18 + 1;
  pFVar12 = pFVar12 + 1;
  goto LAB_00514e3c;
LAB_00514e4f:
  local_98 = (FRandom *)args;
  if (EVar2 - NAME_ACS_NamedExecuteWithResult < 2) {
    min = 1;
    max = 5;
    iVar6 = -0x54;
  }
  else {
    selfcls = (PClass *)&min;
    iVar6 = P_FindLineSpecial(FName::NameData.NameArray[(int)EVar2].Text,(int *)selfcls,&max);
  }
  if (-1 < min && iVar6 != 0) {
    uVar3 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    if ((int)uVar3 < min) {
      pcVar13 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      message = "Not enough parameters for \'%s\' (expected %d, got %d)";
    }
    else {
      if ((int)uVar3 <= max) {
        pFVar15 = sc;
        if (((ctx->Function == (PFunction *)0x0) ||
            ((((ctx->Function->Variants).Array)->Flags & 2) == 0)) ||
           (selfcls = PClassActor::RegistrationInfo.MyClass,
           bVar5 = DObject::IsKindOf((DObject *)ctx->Class,PClassActor::RegistrationInfo.MyClass),
           !bVar5)) {
          pFVar9 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)selfcls);
          FxConstant::FxConstant(pFVar9,sc);
        }
        else {
          pFVar9 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x30,(size_t)selfcls);
          FxSelf::FxSelf((FxSelf *)pFVar9,sc,false);
        }
        this_00 = (FxVMFunctionCall *)
                  FxExpression::operator_new((FxExpression *)0x48,(size_t)pFVar15);
        FxActionSpecialCall::FxActionSpecialCall
                  ((FxActionSpecialCall *)this_00,&pFVar9->super_FxExpression,iVar6,
                   (FArgumentList *)local_98,sc);
        goto LAB_00514e9b;
      }
      pcVar13 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      message = "too many parameters for \'%s\' (expected %d, got %d)";
    }
    FScriptPosition::Message(sc,2,message,pcVar13);
LAB_00514dc3:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  local_38.Index = (this->MethodName).Index;
  cls = PClass::FindClass(&local_38);
  pFVar17 = local_98;
  if ((cls != (PClass *)0x0) && (cls->bExported == true)) {
    local_3c.Index = (this->MethodName).Index;
    bVar5 = CheckArgSize(&local_3c,(FArgumentList *)local_98,1,1,sc);
    if (!bVar5) goto LAB_005155b2;
    this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar17);
    FxDynamicCast::FxDynamicCast
              ((FxDynamicCast *)this_00,cls,
               *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array);
    *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression *)0x0;
LAB_00514e9b:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pp_Var8 = (this_00->super_FxExpression)._vptr_FxExpression;
    goto LAB_00514efd;
  }
  iVar6 = (this->MethodName).Index;
  uVar3 = iVar6 - 0x24e;
  if (uVar3 < 0x30) {
    if ((0xc00000030487U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_005150c0;
    if ((0xc00000UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto code_r0x00515008;
    pFVar16 = local_98;
    local_5c.Index = iVar6;
    bVar5 = CheckArgSize(&local_5c,(FArgumentList *)local_98,2,-1,sc);
    if (!bVar5) goto LAB_005155b2;
    this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pFVar16);
    local_60.Index = (this->MethodName).Index;
    FxMinMax::FxMinMax((FxMinMax *)this_00,(TArray<FxExpression_*,_FxExpression_*> *)pFVar17,
                       &local_60,sc);
    goto LAB_005156c3;
  }
code_r0x00515008:
  switch(iVar6) {
  case 0xd1:
    if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count != 0) {
      local_4c.Index = 0xd1;
      bVar5 = CheckArgSize(&local_4c,(FArgumentList *)local_98,2,2,sc);
      if (!bVar5) goto LAB_005155b2;
      this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x48,(size_t)pFVar17)
      ;
      ppFVar4 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
      FxRandom::FxRandom((FxRandom *)this_00,this->RNG,*ppFVar4,ppFVar4[1],sc,ctx->FromDecorate);
      goto LAB_0051543a;
    }
    this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x48,(size_t)selfcls);
    local_98 = this->RNG;
    pFVar9 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)selfcls);
    sVar18 = 0;
    FxConstant::FxConstant(pFVar9,0,sc);
    this_02 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,sVar18);
    FxConstant::FxConstant(this_02,0xff,sc);
    FxRandom::FxRandom((FxRandom *)this_00,local_98,(FxExpression *)pFVar9,(FxExpression *)this_02,
                       sc,ctx->FromDecorate);
    break;
  case 0xd2:
    local_50.Index = 0xd2;
    bVar5 = CheckArgSize(&local_50,(FArgumentList *)local_98,2,2,sc);
    if (!bVar5) goto LAB_005155b2;
    this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x48,(size_t)pFVar17);
    ppFVar4 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    FxFRandom::FxFRandom((FxFRandom *)this_00,this->RNG,*ppFVar4,ppFVar4[1],sc);
    goto LAB_0051543a;
  case 0xd3:
    local_58.Index = 0xd3;
    pFVar16 = local_98;
    bVar5 = CheckArgSize(&local_58,(FArgumentList *)local_98,0,1,sc);
    if (!bVar5) goto LAB_005155b2;
    this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pFVar16);
    if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
      pFVar11 = (FxExpression *)0x0;
    }
    else {
      pFVar11 = (FxExpression *)((FxExpression *)pFVar17->Name)->_vptr_FxExpression;
    }
    FxRandom2::FxRandom2((FxRandom2 *)this_00,this->RNG,pFVar11,sc,ctx->FromDecorate);
    if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count != 0) goto LAB_005156bc;
    break;
  case 0xd4:
  case 0xd5:
    pFVar16 = local_98;
    local_54.Index = iVar6;
    bVar5 = CheckArgSize(&local_54,(FArgumentList *)local_98,1,-1,sc);
    if (!bVar5) goto LAB_005155b2;
    this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pFVar16);
    FxRandomPick::FxRandomPick
              ((FxRandomPick *)this_00,this->RNG,(TArray<FxExpression_*,_FxExpression_*> *)pFVar17,
               (this->MethodName).Index == 0xd5,sc,ctx->FromDecorate);
    break;
  case 0xd6:
    local_44.Index = 0xd6;
    bVar5 = CheckArgSize(&local_44,(FArgumentList *)local_98,0,0,sc);
    if (!bVar5) goto LAB_005155b2;
    this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar17);
    pFVar7 = (FxSelf *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar17);
    FxSelf::FxSelf(pFVar7,sc,false);
    FxGetClass::FxGetClass((FxGetClass *)this_00,(FxExpression *)pFVar7);
    break;
  case 0xd7:
    local_48.Index = 0xd7;
    pFVar16 = local_98;
    bVar5 = CheckArgSize(&local_48,(FArgumentList *)local_98,1,1,sc);
    if (!bVar5) goto LAB_005155b2;
    this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar16);
    FxGetDefaultByType::FxGetDefaultByType
              ((FxGetDefaultByType *)this_00,
               (FxExpression *)((FxExpression *)pFVar17->Name)->_vptr_FxExpression);
    goto LAB_005156bc;
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe3:
switchD_00515016_caseD_d8:
    FScriptPosition::Message
              (sc,2,"Call to unknown function \'%s\'",FName::NameData.NameArray[iVar6].Text);
    goto LAB_005155b2;
  case 0xe4:
  case 0xe5:
    local_74.Index = iVar6;
    bVar5 = CheckArgSize(&local_74,(FArgumentList *)local_98,2,2,sc);
    if (!bVar5) goto LAB_005155b2;
    bVar5 = (this->MethodName).Index == 0xe4;
    this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar17);
    ppFVar4 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    FxATan2::FxATan2((FxATan2 *)this_00,ppFVar4[!bVar5],ppFVar4[bVar5],sc);
LAB_0051543a:
    (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[1] = (FxExpression *)0x0;
    pFVar11 = (FxExpression *)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
LAB_005156bf:
    pFVar11->_vptr_FxExpression = (_func_int **)0x0;
    break;
  default:
    if (iVar6 == 0xfa) {
      local_70.Index = 0xfa;
      pFVar16 = local_98;
      bVar5 = CheckArgSize(&local_70,(FArgumentList *)local_98,1,1,sc);
      if (!bVar5) goto LAB_005155b2;
      this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar16)
      ;
      FxAbs::FxAbs((FxAbs *)this_00,
                   (FxExpression *)((FxExpression *)pFVar17->Name)->_vptr_FxExpression);
    }
    else {
      if (iVar6 == 0x10b) {
        local_64.Index = 0x10b;
        bVar5 = CheckArgSize(&local_64,(FArgumentList *)local_98,3,3,sc);
        if (!bVar5) goto LAB_005155b2;
        pass.Array = (FxExpression **)0x0;
        pass.Most = 0;
        pass.Count = 0;
        sVar18 = 2;
        TArray<FxExpression_*,_FxExpression_*>::Resize(&pass,2);
        *pass.Array = (FxExpression *)((FxExpression *)pFVar17->Name)->_vptr_FxExpression;
        pass.Array[1] =
             (FxExpression *)(((FxExpression *)pFVar17->Name)->ScriptPosition).FileName.Chars;
        this_01 = (FxMinMax *)FxExpression::operator_new((FxExpression *)0x40,sVar18);
        local_68.Index = 0x265;
        expr = &pass;
        FxMinMax::FxMinMax(this_01,expr,&local_68,sc);
        *pass.Array = (FxExpression *)this_01;
        pass.Array[1] =
             *(FxExpression **)&(((FxExpression *)pFVar17->Name)->ScriptPosition).ScriptLine;
        this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x40,(size_t)expr);
        local_6c.Index = 0x264;
        FxMinMax::FxMinMax((FxMinMax *)this_00,&pass,&local_6c,sc);
        *(undefined8 *)&(((FxExpression *)pFVar17->Name)->ScriptPosition).ScriptLine = 0;
        (((FxExpression *)pFVar17->Name)->ScriptPosition).FileName.Chars = (char *)0x0;
        ((FxExpression *)pFVar17->Name)->_vptr_FxExpression = (_func_int **)0x0;
        TArray<FxExpression_*,_FxExpression_*>::~TArray(&pass);
        break;
      }
      if (iVar6 != 0x1ea) {
        if (iVar6 != 0x204) goto switchD_00515016_caseD_d8;
        if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count - 3 < 2) {
          this_00 = (FxVMFunctionCall *)
                    FxExpression::operator_new((FxExpression *)0x40,(size_t)selfcls);
          FxColorLiteral::FxColorLiteral((FxColorLiteral *)this_00,(FArgumentList *)pFVar17,sc);
          break;
        }
      }
LAB_005150c0:
      pFVar16 = local_98;
      local_40.Index = iVar6;
      bVar5 = CheckArgSize(&local_40,(FArgumentList *)local_98,1,1,sc);
      if (!bVar5) {
LAB_005155b2:
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        return (FxExpression *)0x0;
      }
      iVar6 = (this->MethodName).Index;
      switch(iVar6) {
      case 0x24e:
        ppPVar10 = (PTextureID **)&TypeSInt32;
        break;
      case 0x24f:
        ppPVar10 = (PTextureID **)&TypeUInt32;
        break;
      case 0x250:
        ppPVar10 = (PTextureID **)&TypeBool;
        break;
      case 0x251:
      case 0x252:
      case 0x253:
      case 0x254:
      case 0x256:
      case 599:
switchD_005150ff_caseD_251:
        if (iVar6 == 0x204) {
          ppPVar10 = (PTextureID **)&TypeColor;
        }
        else {
          ppPVar10 = (PTextureID **)&TypeSound;
        }
        break;
      case 0x255:
      case 600:
        ppPVar10 = (PTextureID **)&TypeFloat64;
        break;
      default:
        if (iVar6 == 0x1ea) {
          ppPVar10 = (PTextureID **)&TypeName;
        }
        else if (iVar6 == 0x25f) {
          ppPVar10 = (PTextureID **)&TypeState;
        }
        else if (iVar6 == 0x27c) {
          ppPVar10 = (PTextureID **)&TypeSpriteID;
        }
        else {
          if (iVar6 != 0x27d) goto switchD_005150ff_caseD_251;
          ppPVar10 = &TypeTextureID;
        }
      }
      type = (PType *)*ppPVar10;
      this_00 = (FxVMFunctionCall *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar16)
      ;
      FxTypeCast::FxTypeCast
                ((FxTypeCast *)this_00,
                 (FxExpression *)((FxExpression *)pFVar17->Name)->_vptr_FxExpression,type,true,true)
      ;
    }
LAB_005156bc:
    pFVar11 = (FxExpression *)pFVar17->Name;
    goto LAB_005156bf;
  }
LAB_005156c3:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  pp_Var8 = (this_00->super_FxExpression)._vptr_FxExpression;
LAB_00514efd:
  iVar6 = (*pp_Var8[2])(this_00,ctx);
  return (FxExpression *)CONCAT44(extraout_var,iVar6);
}

Assistant:

FxExpression *FxFunctionCall::Resolve(FCompileContext& ctx)
{
	ABORT(ctx.Class);
	bool error = false;

	for (auto a : ArgList)
	{
		if (a == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Empty function argument.");
			delete this;
			return nullptr;
		}
	}

	PFunction *afd = FindClassMemberFunction(ctx.Class, ctx.Class, MethodName, ScriptPosition, &error);

	if (afd != nullptr)
	{
		if (!CheckFunctionCompatiblity(ScriptPosition, ctx.Function, afd))
		{
			delete this;
			return nullptr;
		}

		auto self = (afd->Variants[0].Flags & VARF_Method)? new FxSelf(ScriptPosition) : nullptr;
		auto x = new FxVMFunctionCall(self, afd, ArgList, ScriptPosition, false);
		delete this;
		return x->Resolve(ctx);
	}

	for (size_t i = 0; i < countof(FxFlops); ++i)
	{
		if (MethodName == FxFlops[i].Name)
		{
			FxExpression *x = new FxFlopFunctionCall(i, ArgList, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}

	int min, max, special;
	if (MethodName == NAME_ACS_NamedExecuteWithResult || MethodName == NAME_CallACS)
	{
		special = -ACS_ExecuteWithResult;
		min = 1;
		max = 5;
	}
	else
	{
		special = P_FindLineSpecial(MethodName.GetChars(), &min, &max);
	}
	if (special != 0 && min >= 0)
	{
		int paramcount = ArgList.Size();
		if (paramcount < min)
		{
			ScriptPosition.Message(MSG_ERROR, "Not enough parameters for '%s' (expected %d, got %d)", 
				MethodName.GetChars(), min, paramcount);
			delete this;
			return nullptr;
		}
		else if (paramcount > max)
		{
			ScriptPosition.Message(MSG_ERROR, "too many parameters for '%s' (expected %d, got %d)", 
				MethodName.GetChars(), max, paramcount);
			delete this;
			return nullptr;
		}
		FxExpression *self = (ctx.Function && (ctx.Function->Variants[0].Flags & VARF_Method) && ctx.Class->IsKindOf(RUNTIME_CLASS(PClassActor))) ? new FxSelf(ScriptPosition) : (FxExpression*)new FxConstant(ScriptPosition);
		FxExpression *x = new FxActionSpecialCall(self, special, ArgList, ScriptPosition);
		delete this;
		return x->Resolve(ctx);
	}

	PClass *cls = PClass::FindClass(MethodName);
	if (cls != nullptr && cls->bExported)
	{
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			FxExpression *x = new FxDynamicCast(cls, ArgList[0]);
			ArgList[0] = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			delete this;
			return nullptr;
		}
	}


	// Last but not least: Check builtins and type casts. The random functions can take a named RNG if specified.
	// Note that for all builtins the used arguments have to be nulled in the ArgList so that they won't get deleted before they get used.
	FxExpression *func = nullptr;

	switch (MethodName)
	{
	case NAME_Color:
		if (ArgList.Size() == 3 || ArgList.Size() == 4)
		{
			func = new FxColorLiteral(ArgList, ScriptPosition);
			break;
		}
		// fall through
	case NAME_Bool:
	case NAME_Int:
	case NAME_uInt:
	case NAME_Float:
	case NAME_Double:
	case NAME_Name:
	case NAME_Sound:
	case NAME_State:
	case NAME_SpriteID:
	case NAME_TextureID:
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			PType *type = 
				MethodName == NAME_Bool ? TypeBool :
				MethodName == NAME_Int ? TypeSInt32 :
				MethodName == NAME_uInt ? TypeUInt32 :
				MethodName == NAME_Float ? TypeFloat64 :
				MethodName == NAME_Double ? TypeFloat64 :
				MethodName == NAME_Name ? TypeName :
				MethodName == NAME_SpriteID ? TypeSpriteID :
				MethodName == NAME_TextureID ? TypeTextureID :
				MethodName == NAME_State ? TypeState :
				MethodName == NAME_Color ? TypeColor : (PType*)TypeSound;

			func = new FxTypeCast(ArgList[0], type, true, true);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_GetClass:
		if (CheckArgSize(NAME_GetClass, ArgList, 0, 0, ScriptPosition))
		{
			func = new FxGetClass(new FxSelf(ScriptPosition));
		}
		break;

	case NAME_GetDefaultByType:
		if (CheckArgSize(NAME_GetDefaultByType, ArgList, 1, 1, ScriptPosition))
		{
			func = new FxGetDefaultByType(ArgList[0]);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_Random:
		// allow calling Random without arguments to default to (0, 255)
		if (ArgList.Size() == 0)
		{
			func = new FxRandom(RNG, new FxConstant(0, ScriptPosition), new FxConstant(255, ScriptPosition), ScriptPosition, ctx.FromDecorate);
		}
		else if (CheckArgSize(NAME_Random, ArgList, 2, 2, ScriptPosition))
		{
			func = new FxRandom(RNG, ArgList[0], ArgList[1], ScriptPosition, ctx.FromDecorate);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	case NAME_FRandom:
		if (CheckArgSize(NAME_FRandom, ArgList, 2, 2, ScriptPosition))
		{
			func = new FxFRandom(RNG, ArgList[0], ArgList[1], ScriptPosition);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	case NAME_RandomPick:
	case NAME_FRandomPick:
		if (CheckArgSize(MethodName, ArgList, 1, -1, ScriptPosition))
		{
			func = new FxRandomPick(RNG, ArgList, MethodName == NAME_FRandomPick, ScriptPosition, ctx.FromDecorate);
		}
		break;

	case NAME_Random2:
		if (CheckArgSize(NAME_Random2, ArgList, 0, 1, ScriptPosition))
		{
			func = new FxRandom2(RNG, ArgList.Size() == 0? nullptr : ArgList[0], ScriptPosition, ctx.FromDecorate);
			if (ArgList.Size() > 0) ArgList[0] = nullptr;
		}
		break;

	case NAME_Min:
	case NAME_Max:
		if (CheckArgSize(MethodName, ArgList, 2, -1, ScriptPosition))
		{
			func = new FxMinMax(ArgList, MethodName, ScriptPosition);
		}
		break;

	case NAME_Clamp:
		if (CheckArgSize(MethodName, ArgList, 3, 3, ScriptPosition))
		{
			TArray<FxExpression *> pass;
			pass.Resize(2);
			pass[0] = ArgList[0];
			pass[1] = ArgList[1];
			pass[0] = new FxMinMax(pass, NAME_Max, ScriptPosition);
			pass[1] = ArgList[2];
			func = new FxMinMax(pass, NAME_Min, ScriptPosition);
			ArgList[0] = ArgList[1] = ArgList[2] = nullptr;
		}
		break;

	case NAME_Abs:
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			func = new FxAbs(ArgList[0]);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_ATan2:
	case NAME_VectorAngle:
		if (CheckArgSize(MethodName, ArgList, 2, 2, ScriptPosition))
		{
			func = MethodName == NAME_ATan2 ? new FxATan2(ArgList[0], ArgList[1], ScriptPosition) : new FxATan2(ArgList[1], ArgList[0], ScriptPosition);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	default:
		ScriptPosition.Message(MSG_ERROR, "Call to unknown function '%s'", MethodName.GetChars());
		break;
	}
	if (func != nullptr)
	{
		delete this;
		return func->Resolve(ctx);
	}
	delete this;
	return nullptr;
}